

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closefd.c
# Opt level: O2

void nn_closefd(int fd)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  
  if (-1 < fd) {
    iVar2 = close(fd);
    if (iVar2 != 0) {
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      if ((((0xb < uVar1 - 0x68) || ((0x841U >> (uVar1 - 0x68 & 0x1f) & 1) == 0)) && (uVar1 != 4))
         && (uVar1 != 0xb)) {
        nn_backtrace_print();
        __stream = _stderr;
        pcVar4 = nn_err_strerror(*puVar3);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/closefd.c"
                ,0x2a);
        fflush(_stderr);
        nn_err_abort();
      }
    }
  }
  return;
}

Assistant:

void nn_closefd (int fd)
{
    int rc;
    if (nn_slow (fd < 0)) {
        return;
    }
    rc = close (fd);
    if (nn_fast (rc == 0))
        return;
    errno_assert (errno == EINTR || errno == ETIMEDOUT ||
        errno == EWOULDBLOCK || errno == EINPROGRESS || errno == ECONNRESET);
}